

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_ws(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos1009;
  int yypos1009;
  int yythunkpos1000;
  int yypos1000;
  int yythunkpos996;
  int yypos996;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yymatchChar(G,10);
  if ((iVar4 == 0) || (iVar4 = yy_pod(G), iVar4 == 0)) {
    G->pos = iVar5;
    G->thunkpos = iVar3;
    iVar4 = yymatchString(G,"\n=begin END\n");
    if (iVar4 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
      iVar4 = yymatchChar(G,0x20);
      if (iVar4 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar3;
        iVar4 = yymatchChar(G,0xc);
        if (iVar4 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar3;
          iVar4 = yymatchChar(G,0xb);
          if (iVar4 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar3;
            iVar4 = yymatchChar(G,9);
            if (iVar4 == 0) {
              G->pos = iVar5;
              G->thunkpos = iVar3;
              iVar4 = yymatchString(G,anon_var_dwarf_3bbf);
              if (iVar4 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar3;
                iVar4 = yymatchString(G,anon_var_dwarf_3bcb);
                if (iVar4 == 0) {
                  G->pos = iVar5;
                  G->thunkpos = iVar3;
                  iVar4 = yymatchString(G,"\n=END\n");
                  if (iVar4 == 0) {
                    G->pos = iVar5;
                    G->thunkpos = iVar3;
                    iVar4 = yy_end_of_line(G);
                    if (iVar4 == 0) {
                      G->pos = iVar5;
                      G->thunkpos = iVar3;
                      iVar5 = yy_comment(G);
                      if (iVar5 == 0) {
                        G->pos = iVar1;
                        G->thunkpos = iVar2;
                        return 0;
                      }
                    }
                  }
                  else {
                    do {
                      iVar1 = G->pos;
                      iVar2 = G->thunkpos;
                      iVar5 = yymatchDot(G);
                    } while (iVar5 != 0);
                    G->pos = iVar1;
                    G->thunkpos = iVar2;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      do {
        iVar1 = G->pos;
        iVar2 = G->thunkpos;
        iVar5 = yymatchDot(G);
      } while (iVar5 != 0);
      G->pos = iVar1;
      G->thunkpos = iVar2;
    }
  }
  return 1;
}

Assistant:

YY_RULE(int) yy_ws(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "ws"));

  {  int yypos996= G->pos, yythunkpos996= G->thunkpos;  if (!yymatchChar(G, '\n')) goto l997;
  if (!yy_pod(G))  goto l997;
  goto l996;
  l997:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\n=begin END\n")) goto l998;

  l999:;	
  {  int yypos1000= G->pos, yythunkpos1000= G->thunkpos;  if (!yymatchDot(G)) goto l1000;  goto l999;
  l1000:;	  G->pos= yypos1000; G->thunkpos= yythunkpos1000;
  }  goto l996;
  l998:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, ' ')) goto l1001;
  goto l996;
  l1001:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\f')) goto l1002;
  goto l996;
  l1002:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\v')) goto l1003;
  goto l996;
  l1003:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchChar(G, '\t')) goto l1004;
  goto l996;
  l1004:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\205")) goto l1005;
  goto l996;
  l1005:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\240")) goto l1006;
  goto l996;
  l1006:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yymatchString(G, "\n=END\n")) goto l1007;

  l1008:;	
  {  int yypos1009= G->pos, yythunkpos1009= G->thunkpos;  if (!yymatchDot(G)) goto l1009;  goto l1008;
  l1009:;	  G->pos= yypos1009; G->thunkpos= yythunkpos1009;
  }  goto l996;
  l1007:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yy_end_of_line(G))  goto l1010;
  goto l996;
  l1010:;	  G->pos= yypos996; G->thunkpos= yythunkpos996;  if (!yy_comment(G))  goto l995;

  }
  l996:;	  yyprintf((stderr, "  ok   ws"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l995:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "ws"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}